

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O0

void __thiscall
ODDLParser::OpenDDLParserTest_parsePrimitiveDataTypeWithArrayTest_Test::
~OpenDDLParserTest_parsePrimitiveDataTypeWithArrayTest_Test
          (OpenDDLParserTest_parsePrimitiveDataTypeWithArrayTest_Test *this)

{
  OpenDDLParserTest_parsePrimitiveDataTypeWithArrayTest_Test *this_local;
  
  ~OpenDDLParserTest_parsePrimitiveDataTypeWithArrayTest_Test(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, parsePrimitiveDataTypeWithArrayTest) {
    size_t len1(0);
    char token[] = "float[3]", *end(findEnd(token, len1));

    Value::ValueType type;
    size_t arrayLen(0);

    char *in = OpenDDLParser::parsePrimitiveDataType(token, end, type, arrayLen);
    EXPECT_EQ(Value::ValueType::ddl_float, type);
    EXPECT_EQ(3U, arrayLen);
    EXPECT_NE(in, token);
}